

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcbormap.h
# Opt level: O3

QCborValue * __thiscall
QCborMap::value(QCborValue *__return_storage_ptr__,QCborMap *this,QLatin1StringView key)

{
  long lVar1;
  long lVar2;
  QLatin1String QVar3;
  QCborValueConstRef QVar4;
  undefined1 auVar5 [16];
  
  QVar3.m_data = (char *)key.m_size;
  QVar3.m_size = (qsizetype)this;
  auVar5 = QCborMap::constFind(QVar3);
  lVar1 = *(long *)this;
  lVar2 = QCborMap::size();
  if ((auVar5._0_8_ == lVar1) && (auVar5._8_8_ == lVar2 * 2 + 1)) {
    __return_storage_ptr__->n = 0;
    __return_storage_ptr__->container = (QCborContainerPrivate *)0x0;
    __return_storage_ptr__->t = Undefined;
  }
  else {
    QVar4.i = auVar5._0_8_;
    QVar4.d = (QCborContainerPrivate *)__return_storage_ptr__;
    QCborValueConstRef::concrete(QVar4);
  }
  return __return_storage_ptr__;
}

Assistant:

QCborValue value(const QString & key) const
    { const_iterator it = find(key); return comparesEqual(it, end()) ? QCborValue() : it.value(); }